

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int UTF16BEToUTF8(uchar *out,int *outlen,uchar *inb,int *inlenb)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  uchar *processed;
  int iVar5;
  byte *pbVar6;
  byte bVar7;
  uint uVar8;
  
  iVar5 = (int)out;
  iVar3 = *outlen;
  uVar2 = *inlenb;
  if ((uVar2 & 0x80000001) == 1) {
    uVar2 = uVar2 - 1;
    *inlenb = uVar2;
  }
  pbVar6 = out + iVar3;
  pbVar4 = inb;
  while( true ) {
    iVar3 = (int)pbVar4;
    if (inb + (ulong)(uint)((int)uVar2 / 2) * 2 <= pbVar4) break;
    uVar8 = (uint)CONCAT11(*pbVar4,pbVar4[1]);
    pbVar1 = pbVar4 + 2;
    if ((*pbVar4 & 0xfc) == 0xd8) {
      if ((inb + (ulong)(uint)((int)uVar2 / 2) * 2 <= pbVar1) || ((*pbVar1 & 0xfffffffc) != 0xdc)) {
        *outlen = (int)out - iVar5;
        *inlenb = iVar3 - (int)inb;
        return -2;
      }
      uVar8 = (uVar8 & 0x3ff) * 0x400 + ((*pbVar1 & 3) << 8 | (uint)pbVar4[3]) + 0x10000;
      pbVar1 = pbVar4 + 4;
    }
    pbVar4 = pbVar1;
    if (pbVar6 <= out) break;
    if (uVar8 < 0x80) {
      bVar7 = (byte)uVar8;
      iVar3 = -6;
    }
    else if (uVar8 < 0x800) {
      bVar7 = (byte)(uVar8 >> 6) | 0xc0;
      iVar3 = 0;
    }
    else if (uVar8 < 0x10000) {
      bVar7 = (byte)(uVar8 >> 0xc) | 0xe0;
      iVar3 = 6;
    }
    else {
      bVar7 = (byte)(uVar8 >> 0x12) | 0xf0;
      iVar3 = 0xc;
    }
    *out = bVar7;
    while ((out = out + 1, -1 < iVar3 && (out < pbVar6))) {
      *out = (byte)(uVar8 >> ((byte)iVar3 & 0x1f)) & 0x3f | 0x80;
      iVar3 = iVar3 + -6;
    }
  }
  *outlen = (int)out - iVar5;
  *inlenb = iVar3 - (int)inb;
  return *outlen;
}

Assistant:

static int
UTF16BEToUTF8(unsigned char* out, int *outlen,
            const unsigned char* inb, int *inlenb)
{
    unsigned char* outstart = out;
    const unsigned char* processed = inb;
    unsigned char* outend = out + *outlen;
    unsigned short* in = (unsigned short*) inb;
    unsigned short* inend;
    unsigned int c, d, inlen;
    unsigned char *tmp;
    int bits;

    if ((*inlenb % 2) == 1)
        (*inlenb)--;
    inlen = *inlenb / 2;
    inend= in + inlen;
    while (in < inend) {
	if (xmlLittleEndian) {
	    tmp = (unsigned char *) in;
	    c = *tmp++;
	    c = c << 8;
	    c = c | (unsigned int) *tmp;
	    in++;
	} else {
	    c= *in++;
	}
        if ((c & 0xFC00) == 0xD800) {    /* surrogates */
	    if (in >= inend) {           /* (in > inend) shouldn't happens */
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
	    if (xmlLittleEndian) {
		tmp = (unsigned char *) in;
		d = *tmp++;
		d = d << 8;
		d = d | (unsigned int) *tmp;
		in++;
	    } else {
		d= *in++;
	    }
            if ((d & 0xFC00) == 0xDC00) {
                c &= 0x03FF;
                c <<= 10;
                c |= d & 0x03FF;
                c += 0x10000;
            }
            else {
		*outlen = out - outstart;
		*inlenb = processed - inb;
	        return(-2);
	    }
        }

	/* assertion: c is a single UTF-4 value */
        if (out >= outend)
	    break;
        if      (c <    0x80) {  *out++=  c;                bits= -6; }
        else if (c <   0x800) {  *out++= ((c >>  6) & 0x1F) | 0xC0;  bits=  0; }
        else if (c < 0x10000) {  *out++= ((c >> 12) & 0x0F) | 0xE0;  bits=  6; }
        else                  {  *out++= ((c >> 18) & 0x07) | 0xF0;  bits= 12; }

        for ( ; bits >= 0; bits-= 6) {
            if (out >= outend)
	        break;
            *out++= ((c >> bits) & 0x3F) | 0x80;
        }
	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlenb = processed - inb;
    return(*outlen);
}